

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

Extension * __thiscall
google::protobuf::internal::ExtensionSet::FindOrNull(ExtensionSet *this,int key)

{
  KeyValue *pKVar1;
  KeyValue *pKVar2;
  Extension *pEVar3;
  int local_1c [2];
  int key_local;
  
  local_1c[0] = key;
  if (0x100 < this->flat_capacity_) {
    pEVar3 = FindOrNullInLargeMap(this,key);
    return pEVar3;
  }
  pKVar1 = flat_end(this);
  pKVar2 = flat_begin(this);
  pKVar2 = std::
           __lower_bound<google::protobuf::internal::ExtensionSet::KeyValue_const*,int,__gnu_cxx::__ops::_Iter_comp_val<google::protobuf::internal::ExtensionSet::KeyValue::FirstComparator>>
                     (pKVar2,pKVar1,local_1c);
  if (pKVar2 == pKVar1) {
    pEVar3 = (Extension *)0x0;
  }
  else {
    pEVar3 = (Extension *)0x0;
    if (pKVar2->first == local_1c[0]) {
      pEVar3 = &pKVar2->second;
    }
  }
  return pEVar3;
}

Assistant:

const ExtensionSet::Extension* ExtensionSet::FindOrNull(int key) const {
  if (PROTOBUF_PREDICT_FALSE(is_large())) {
    return FindOrNullInLargeMap(key);
  }
  const KeyValue* end = flat_end();
  const KeyValue* it =
      std::lower_bound(flat_begin(), end, key, KeyValue::FirstComparator());
  if (it != end && it->first == key) {
    return &it->second;
  }
  return NULL;
}